

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O0

void __thiscall
JtagAnalyzer::AdvanceTck(JtagAnalyzer *this,Frame *frm,JtagShiftedData *shifted_data)

{
  AnalyzerChannelData *pAVar1;
  JtagTAPState JVar2;
  ulong uVar3;
  U64 ending_sample_number;
  long lVar4;
  JtagShiftedData *shifted_data_local;
  Frame *frm_local;
  JtagAnalyzer *this_local;
  
  if (this->mTrst != (AnalyzerChannelData *)0x0) {
    pAVar1 = this->mTrst;
    AnalyzerChannelData::GetSampleOfNextEdge();
    uVar3 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
    if ((uVar3 & 1) != 0) {
      AnalyzerChannelData::AdvanceToNextEdge();
      ending_sample_number = AnalyzerChannelData::GetSampleNumber();
      CloseFrameV2(this,frm,shifted_data,ending_sample_number);
      JtagTAP_Controller::SetState(&this->mTAPCtrl,TestLogicReset);
      lVar4 = AnalyzerChannelData::GetSampleNumber();
      *(long *)frm = lVar4 + 1;
      JVar2 = JtagTAP_Controller::GetCurrState(&this->mTAPCtrl);
      frm[0x20] = SUB41(JVar2,0);
      AnalyzerChannelData::AdvanceToNextEdge();
      pAVar1 = this->mTck;
      AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
      return;
    }
  }
  AnalyzerChannelData::AdvanceToNextEdge();
  return;
}

Assistant:

void JtagAnalyzer::AdvanceTck( Frame& frm, JtagShiftedData& shifted_data )
{
    if( mTrst != NULL && mTrst->WouldAdvancingToAbsPositionCauseTransition( mTck->GetSampleOfNextEdge() ) )
    {
        mTrst->AdvanceToNextEdge();

        // close the frame and add it
        CloseFrameV2( frm, shifted_data, mTrst->GetSampleNumber() );

        // reset the TAP state
        mTAPCtrl.SetState( TestLogicReset );

        // prepare the reset frame
        frm.mStartingSampleInclusive = mTrst->GetSampleNumber() + 1;
        frm.mType = mTAPCtrl.GetCurrState();

        // find the rising edge of TRST
        mTrst->AdvanceToNextEdge();

        // bring TCK here too
        mTck->AdvanceToAbsPosition( mTrst->GetSampleNumber() );
    }
    else
    {
        mTck->AdvanceToNextEdge();
    }
}